

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

void __thiscall BinNE<0,_4,_1>::BinNE(BinNE<0,_4,_1> *this,IntView<0> _x,IntView<4> _y,BoolView *_r)

{
  IntVar *pIVar1;
  
  pIVar1 = _x.var;
  Propagator::Propagator(&this->super_Propagator);
  Checker::Checker(&this->super_Checker);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__BinNE_001f3720;
  (this->super_Checker)._vptr_Checker = (_func_int **)&DAT_001f3788;
  (this->x).var = pIVar1;
  (this->x).a = (int)_x._8_8_;
  (this->x).b = (int)((ulong)_x._8_8_ >> 0x20);
  (this->y).var = _y.var;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,0,8);
  pIVar1 = (this->y).var;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,1,8);
  BoolView::attach(&this->r,&this->super_Propagator,2,2);
  return;
}

Assistant:

BinNE(IntView<U> _x, IntView<V> _y, BoolView _r = bv_true) : x(_x), y(_y), r(std::move(_r)) {
		x.attach(this, 0, EVENT_F);
		y.attach(this, 1, EVENT_F);
		if (R != 0) {
			r.attach(this, 2, EVENT_L);
		}
		//		printf("BinNE: %d %d %d\n", U, V, R);
	}